

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::SharedDtor(FileDescriptorProto *this)

{
  string *psVar1;
  FileDescriptorProto *this_local;
  
  if ((this->name_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->name_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->package_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->package_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if (this != default_instance_) {
    if (this->options_ != (FileOptions *)0x0) {
      (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->source_code_info_ != (SourceCodeInfo *)0x0) {
      (*(this->source_code_info_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
  }
  return;
}

Assistant:

void FileDescriptorProto::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (package_ != &::google::protobuf::internal::kEmptyString) {
    delete package_;
  }
  if (this != default_instance_) {
    delete options_;
    delete source_code_info_;
  }
}